

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simSymStr.c
# Opt level: O0

void Sim_SymmsBalanceCollect_rec(Abc_Obj_t *pNode,Vec_Ptr_t *vNodes)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  Vec_Ptr_t *vNodes_local;
  Abc_Obj_t *pNode_local;
  
  iVar1 = Abc_ObjIsComplement(pNode);
  if (iVar1 == 0) {
    iVar1 = Abc_ObjIsCi(pNode);
    if (iVar1 == 0) {
      pAVar2 = Abc_ObjChild0(pNode);
      Sim_SymmsBalanceCollect_rec(pAVar2,vNodes);
      pAVar2 = Abc_ObjChild1(pNode);
      Sim_SymmsBalanceCollect_rec(pAVar2,vNodes);
    }
    else {
      Vec_PtrPushUnique(vNodes,pNode);
    }
  }
  else {
    Vec_PtrPushUnique(vNodes,pNode);
  }
  return;
}

Assistant:

void Sim_SymmsBalanceCollect_rec( Abc_Obj_t * pNode, Vec_Ptr_t * vNodes )
{
    // if the new node is complemented, another gate begins
    if ( Abc_ObjIsComplement(pNode) )
    {
        Vec_PtrPushUnique( vNodes, pNode );
        return;
    }
    // if pNew is the PI node, return
    if ( Abc_ObjIsCi(pNode) )
    {
        Vec_PtrPushUnique( vNodes, pNode );
        return;    
    }
    // go through the branches
    Sim_SymmsBalanceCollect_rec( Abc_ObjChild0(pNode), vNodes );
    Sim_SymmsBalanceCollect_rec( Abc_ObjChild1(pNode), vNodes );
}